

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbinode.cpp
# Opt level: O1

void __thiscall icu_63::RBBINode::~RBBINode(RBBINode *this)

{
  UnicodeSet *this_00;
  RBBINode *pRVar1;
  void *in_RSI;
  
  this_00 = this->fInputSet;
  if (this_00 != (UnicodeSet *)0x0) {
    UnicodeSet::~UnicodeSet(this_00);
    UMemory::operator_delete((UMemory *)this_00,in_RSI);
  }
  this->fInputSet = (UnicodeSet *)0x0;
  if ((this->fType & ~varRef) != setRef) {
    pRVar1 = this->fLeftChild;
    if (pRVar1 != (RBBINode *)0x0) {
      ~RBBINode(pRVar1);
      UMemory::operator_delete((UMemory *)pRVar1,in_RSI);
    }
    this->fLeftChild = (RBBINode *)0x0;
    pRVar1 = this->fRightChild;
    if (pRVar1 != (RBBINode *)0x0) {
      ~RBBINode(pRVar1);
      UMemory::operator_delete((UMemory *)pRVar1,in_RSI);
    }
    this->fRightChild = (RBBINode *)0x0;
  }
  if (this->fFirstPosSet != (UVector *)0x0) {
    (*(this->fFirstPosSet->super_UObject)._vptr_UObject[1])();
  }
  if (this->fLastPosSet != (UVector *)0x0) {
    (*(this->fLastPosSet->super_UObject)._vptr_UObject[1])();
  }
  if (this->fFollowPos != (UVector *)0x0) {
    (*(this->fFollowPos->super_UObject)._vptr_UObject[1])();
  }
  UnicodeString::~UnicodeString(&this->fText);
  return;
}

Assistant:

RBBINode::~RBBINode() {
    // printf("deleting node %8x   serial %4d\n", this, this->fSerialNum);
    delete fInputSet;
    fInputSet = NULL;

    switch (this->fType) {
    case varRef:
    case setRef:
        // for these node types, multiple instances point to the same "children"
        // Storage ownership of children handled elsewhere.  Don't delete here.
        break;

    default:
        delete        fLeftChild;
        fLeftChild =   NULL;
        delete        fRightChild;
        fRightChild = NULL;
    }


    delete fFirstPosSet;
    delete fLastPosSet;
    delete fFollowPos;

}